

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dthinker.cpp
# Opt level: O2

void DThinker::DestroyThinkersInList(FThinkerList *list)

{
  DThinker *pDVar1;
  DThinker *pDVar2;
  
  pDVar2 = list->Sentinel;
  if (pDVar2 != (DThinker *)0x0) {
    while (pDVar1 = pDVar2->NextThinker, pDVar1 != pDVar2) {
      if (pDVar1 == (DThinker *)0x0) {
        __assert_fail("node != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/dthinker.cpp"
                      ,0x1be,"static void DThinker::DestroyThinkersInList(FThinkerList &)");
      }
      (*(pDVar1->super_DObject)._vptr_DObject[4])(pDVar1);
      pDVar2 = list->Sentinel;
    }
    (*(pDVar2->super_DObject)._vptr_DObject[4])();
    list->Sentinel = (DThinker *)0x0;
  }
  return;
}

Assistant:

void DThinker::DestroyThinkersInList (FThinkerList &list)
{
	if (list.Sentinel != NULL)
	{
		for (DThinker *node = list.Sentinel->NextThinker; node != list.Sentinel; node = list.Sentinel->NextThinker)
		{
			assert(node != NULL);
			node->Destroy();
		}
		list.Sentinel->Destroy();
		list.Sentinel = NULL;
	}
}